

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfft_common.c
# Opt level: O1

int dfft_create_plan_common
              (dfft_plan *p,int ndim,int *gdim,int *inembed,int *oembed,int *pdim,int *pidx,
              int row_m,int input_cyclic,int output_cyclic,MPI_Comm comm,int *proc_map,int device)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int *__dest;
  ulong uVar8;
  plan_t *ppVar9;
  int **ppiVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  size_t size;
  long lVar19;
  size_t sVar20;
  int nump;
  size_t local_50;
  long local_48;
  int *local_40;
  int *local_38;
  
  p->comm = comm;
  MPI_Comm_size(comm,&nump);
  lVar19 = (long)nump;
  iVar3 = 4;
  if ((nump & nump - 1U) == 0) {
    local_40 = inembed;
    local_38 = oembed;
    piVar5 = (int *)malloc(lVar19 << 2);
    p->proc_map = piVar5;
    memcpy(piVar5,proc_map,lVar19 << 2);
    lVar19 = (long)ndim;
    sVar20 = lVar19 * 4;
    piVar5 = (int *)malloc(sVar20);
    p->pdim = piVar5;
    piVar6 = (int *)malloc(sVar20);
    p->gdim = piVar6;
    piVar7 = (int *)malloc(sVar20);
    p->pidx = piVar7;
    piVar7 = (int *)malloc(sVar20);
    p->inembed = piVar7;
    local_50 = sVar20;
    __dest = (int *)malloc(sVar20);
    p->oembed = __dest;
    p->ndim = ndim;
    uVar12 = (ulong)(uint)ndim;
    if (0 < ndim) {
      uVar8 = 0;
      do {
        uVar15 = gdim[uVar8];
        piVar6[uVar8] = uVar15;
        if ((uVar15 & uVar15 - 1) != 0) {
          return 5;
        }
        piVar5[uVar8] = pdim[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar12 != uVar8);
    }
    local_48 = lVar19;
    if (local_40 == (int *)0x0) {
      if (0 < ndim) {
        uVar8 = 0;
        do {
          piVar7[uVar8] = piVar6[uVar8] / piVar5[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar12 != uVar8);
      }
    }
    else if (0 < ndim) {
      memcpy(piVar7,local_40,uVar12 * 4);
    }
    if (local_38 == (int *)0x0) {
      if (0 < ndim) {
        uVar8 = 0;
        do {
          __dest[uVar8] = piVar6[uVar8] / piVar5[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar12 != uVar8);
      }
    }
    else if (0 < ndim) {
      memcpy(__dest,local_38,uVar12 * 4);
    }
    sVar20 = (long)nump << 2;
    piVar5 = (int *)malloc(sVar20);
    p->offset_send = piVar5;
    piVar5 = (int *)malloc(sVar20);
    p->offset_recv = piVar5;
    piVar5 = (int *)malloc(sVar20);
    p->nsend = piVar5;
    piVar5 = (int *)malloc(sVar20);
    p->nrecv = piVar5;
    if (device == 0) {
      sVar20 = local_48 * 0x18;
      ppVar9 = (plan_t *)malloc(sVar20);
      p->plans_short_forward = ppVar9;
      ppVar9 = (plan_t *)malloc(sVar20);
      p->plans_long_forward = ppVar9;
      ppVar9 = (plan_t *)malloc(sVar20);
      p->plans_short_inverse = ppVar9;
      ppVar9 = (plan_t *)malloc(sVar20);
      p->plans_long_inverse = ppVar9;
    }
    iVar3 = *gdim;
    iVar18 = *pdim;
    *piVar7 = iVar3 / iVar18;
    *__dest = iVar3 / iVar18;
    if (ndim < 1) {
      iVar3 = 1;
      iVar18 = 1;
    }
    else {
      iVar18 = 1;
      uVar8 = 0;
      iVar3 = 1;
      do {
        iVar18 = iVar18 * piVar7[uVar8];
        iVar3 = iVar3 * __dest[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar12 != uVar8);
    }
    p->size_in = iVar18;
    p->size_out = iVar3;
    piVar5 = (int *)malloc(local_50);
    p->k0 = piVar5;
    if (0 < ndim) {
      uVar8 = 0;
      do {
        uVar1 = (long)gdim[uVar8] / (long)pdim[uVar8];
        uVar15 = 1;
        iVar3 = (int)uVar1;
        uVar2 = gdim[uVar8];
        if (1 < iVar3) {
          while (uVar15 = uVar2, iVar3 < (int)uVar15) {
            uVar2 = (uint)((ulong)uVar15 / (uVar1 & 0xffffffff));
          }
        }
        piVar5[uVar8] = uVar15;
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar12);
    }
    sVar20 = local_48 << 3;
    ppiVar10 = (int **)malloc(sVar20);
    p->rho_L = ppiVar10;
    ppiVar10 = (int **)malloc(sVar20);
    p->rho_pk0 = ppiVar10;
    ppiVar10 = (int **)malloc(sVar20);
    p->rho_Lk0 = ppiVar10;
    if (0 < ndim) {
      uVar8 = 0;
      do {
        iVar3 = pdim[uVar8];
        uVar1 = (long)gdim[uVar8] / (long)iVar3;
        iVar4 = (int)uVar1;
        piVar5 = (int *)malloc((long)iVar4 << 2);
        p->rho_L[uVar8] = piVar5;
        piVar5 = (int *)malloc((ulong)((long)iVar3 << 2) / (ulong)(long)p->k0[uVar8]);
        p->rho_pk0[uVar8] = piVar5;
        piVar5 = (int *)malloc((ulong)((long)iVar4 << 2) / (ulong)(long)p->k0[uVar8]);
        p->rho_Lk0[uVar8] = piVar5;
        piVar5 = p->rho_L[uVar8];
        if (iVar4 == 1) {
          *piVar5 = 0;
        }
        else if (0 < iVar4) {
          uVar11 = 0;
          do {
            iVar3 = 0;
            iVar16 = 1;
            uVar13 = uVar11 & 0xffffffff;
            do {
              uVar15 = (uint)uVar13;
              uVar13 = uVar13 >> 1;
              iVar3 = (uVar15 & 1) + iVar3 * 2;
              iVar16 = iVar16 * 2;
            } while (iVar16 < iVar4);
            piVar5[uVar11] = iVar3;
            uVar11 = uVar11 + 1;
          } while (uVar11 != (uVar1 & 0xffffffff));
        }
        piVar5 = p->k0;
        uVar11 = (long)pdim[uVar8] / (long)piVar5[uVar8];
        piVar6 = p->rho_pk0[uVar8];
        iVar3 = (int)uVar11;
        if (iVar3 == 1) {
          *piVar6 = 0;
        }
        else if (0 < iVar3) {
          uVar13 = 0;
          do {
            iVar14 = 0;
            iVar16 = 1;
            uVar17 = uVar13 & 0xffffffff;
            do {
              uVar15 = (uint)uVar17;
              uVar17 = uVar17 >> 1;
              iVar14 = (uVar15 & 1) + iVar14 * 2;
              iVar16 = iVar16 * 2;
            } while (iVar16 < iVar3);
            piVar6[uVar13] = iVar14;
            uVar13 = uVar13 + 1;
          } while (uVar13 != (uVar11 & 0xffffffff));
        }
        uVar1 = (long)((ulong)(uint)(iVar4 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) /
                (long)piVar5[uVar8];
        piVar5 = p->rho_Lk0[uVar8];
        iVar3 = (int)uVar1;
        if (iVar3 == 1) {
          *piVar5 = 0;
        }
        else if (0 < iVar3) {
          uVar11 = 0;
          do {
            iVar4 = 0;
            iVar16 = 1;
            uVar13 = uVar11 & 0xffffffff;
            do {
              uVar15 = (uint)uVar13;
              uVar13 = uVar13 >> 1;
              iVar4 = (uVar15 & 1) + iVar4 * 2;
              iVar16 = iVar16 * 2;
            } while (iVar16 < iVar3);
            piVar5[uVar11] = iVar4;
            uVar11 = uVar11 + 1;
          } while (uVar11 != (uVar1 & 0xffffffff));
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar12);
    }
    if (0 < ndim) {
      piVar5 = p->pidx;
      uVar8 = 0;
      do {
        piVar5[uVar8] = pidx[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar12 != uVar8);
    }
    iVar3 = 2;
    if (device == 0) {
      iVar4 = dfft_init_local_fft();
      iVar3 = 1;
      if (iVar4 == 0) {
        p->dfft_multi = 0;
        p->device = 0;
        if (0 < ndim) {
          uVar8 = 0;
          do {
            iVar4 = (gdim[uVar8] / pdim[uVar8]) * (iVar18 / p->inembed[uVar8]);
            iVar3 = iVar4 / p->k0[uVar8];
            dfft_create_1d_plan(p->plans_short_forward + uVar8,p->k0[uVar8],1,iVar3,1,iVar3,1,0);
            iVar3 = iVar4 / p->k0[uVar8];
            dfft_create_1d_plan(p->plans_short_inverse + uVar8,p->k0[uVar8],1,iVar3,1,iVar3,1,1);
            iVar3 = gdim[uVar8] / pdim[uVar8];
            iVar4 = iVar4 / iVar3;
            dfft_create_1d_plan(p->plans_long_forward + uVar8,iVar3,1,iVar4,1,iVar4,1,0);
            dfft_create_1d_plan(p->plans_long_inverse + uVar8,iVar3,1,iVar4,1,iVar4,1,1);
            iVar18 = (iVar18 / p->inembed[uVar8]) * p->oembed[uVar8];
            uVar8 = uVar8 + 1;
          } while (uVar8 != uVar12);
        }
        if (ndim < 1) {
          iVar3 = 1;
        }
        else {
          iVar3 = 1;
          uVar8 = 0;
          do {
            iVar18 = p->oembed[uVar8];
            if (p->oembed[uVar8] < p->inembed[uVar8]) {
              iVar18 = p->inembed[uVar8];
            }
            iVar3 = iVar3 * iVar18;
            uVar8 = uVar8 + 1;
          } while (uVar12 != uVar8);
        }
        p->scratch_size = iVar3;
        size = (long)iVar3 << 3;
        dfft_allocate_aligned_memory(&p->scratch,size);
        dfft_allocate_aligned_memory(&p->scratch_2,size);
        dfft_allocate_aligned_memory(&p->scratch_3,size);
        p->input_cyclic = input_cyclic;
        p->output_cyclic = output_cyclic;
        p->row_m = row_m;
        p->init = 1;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int dfft_create_plan_common(dfft_plan *p,
    int ndim, int *gdim,
    int *inembed, int *oembed,
    int *pdim, int *pidx, int row_m,
    int input_cyclic, int output_cyclic,
    MPI_Comm comm,
    int *proc_map,
    int device)
    {
    int s,nump;

    p->comm = comm;

    MPI_Comm_size(comm,&nump);

    /* number of processor must be power of two */
    if (nump & (nump-1)) return 4;

    /* Allocate memory for processor map and copy over */
    p->proc_map = malloc(sizeof(int)*nump);
    memcpy(p->proc_map, proc_map, sizeof(int)*nump);

    p->pdim = malloc(ndim*sizeof(int));
    p->gdim = malloc(ndim*sizeof(int));
    p->pidx = malloc(ndim*sizeof(int));

    p->inembed = malloc(ndim*sizeof(int));
    p->oembed = malloc(ndim*sizeof(int));

    p->ndim = ndim;

    int i;
    for (i = 0; i < ndim; i++)
        {
        p->gdim[i] = gdim[i];

        /* Every dimension must be a power of two */
        if (gdim[i] & (gdim[i]-1)) return 5;

        p->pdim[i] = pdim[i];
        }

    if (inembed != NULL)
        {
        for (i = 0; i < ndim; i++)
            p->inembed[i] = inembed[i];
        }
    else
        {
        for (i = 0; i < ndim; i++)
            p->inembed[i] = p->gdim[i]/p->pdim[i];
        }

    if (oembed != NULL)
        {
        for (i = 0; i < ndim; i++)
            p->oembed[i] = oembed[i];
        }
    else
        {
        for (i = 0; i < ndim; i++)
            p->oembed[i] = p->gdim[i]/p->pdim[i];
        }

    p->offset_send = (int *)malloc(sizeof(int)*nump);
    p->offset_recv = (int *)malloc(sizeof(int)*nump);
    p->nsend = (int *)malloc(sizeof(int)*nump);
    p->nrecv = (int *)malloc(sizeof(int)*nump);

    if (!device)
        {
        #ifdef ENABLE_HOST
        p->plans_short_forward = malloc(sizeof(plan_t)*ndim);
        p->plans_long_forward = malloc(sizeof(plan_t)*ndim);
        p->plans_short_inverse = malloc(sizeof(plan_t)*ndim);
        p->plans_long_inverse = malloc(sizeof(plan_t)*ndim);
        #else
        return 3;
        #endif
        }

    /* local problem size */
    int size_in = 1;
    int size_out = 1;

    /* since we expect column-major input, the leading dimension
      has no embedding */
    p->inembed[0] = gdim[0]/pdim[0];
    p->oembed[0] = gdim[0]/pdim[0];

    for (i = 0; i < ndim ; ++i)
        {
        size_in *= p->inembed[i];
        size_out *= p->oembed[i];
        }

    p->size_in = size_in;
    p->size_out = size_out;

    /* find length k0 of last stage of butterflies */
    p->k0 = malloc(sizeof(int)*ndim);

    for (i = 0; i< ndim; ++i)
        {
        int length = gdim[i]/pdim[i];
        if (length > 1)
            {
            int c;
            for (c=gdim[i]; c>length; c /= length)
                ;
            p->k0[i] = c;
            }
        else
            {
            p->k0[i] = 1;
            }
        }

    p->rho_L = (int **)malloc(ndim*sizeof(int *));
    p->rho_pk0= (int **)malloc(ndim*sizeof(int *));
    p->rho_Lk0 = (int **)malloc(ndim*sizeof(int *));

    for (i = 0; i < ndim; ++i)
        {
        int length = gdim[i]/pdim[i];
        p->rho_L[i] = (int *) malloc(sizeof(int)*length);
        p->rho_pk0[i] = (int *) malloc(sizeof(int)*pdim[i]/(p->k0[i]));
        p->rho_Lk0[i] = (int *) malloc(sizeof(int)*length/(p->k0[i]));
        bitrev_init(length, p->rho_L[i]);
        bitrev_init(pdim[i]/(p->k0[i]),p->rho_pk0[i]);
        bitrev_init(length/(p->k0[i]),p->rho_Lk0[i]);
        }

    /* processor coordinates */
    for (i = 0; i < ndim; ++i)
        {
        p->pidx[i] = pidx[i];
        }

    /* init local FFT library */
    int res;
    if (!device)
        {
        #ifdef ENABLE_HOST
        res = dfft_init_local_fft();
        #else
        return 3;
        #endif
        }
    else
        {
        #ifdef ENABLE_CUDA
        res = dfft_cuda_init_local_fft();
        #else
        return 2;
        #endif
        }

    if (res) return 1;

    int size = size_in;

    p->dfft_multi = 0;

    p->device = device;

    if (device)
        {
        /* use multidimensional local transforms */
        dfft_create_execution_flow(p);

        /* allocate storage for variables */
        int dmax = p->max_depth + 2;
        p->rev_j1 = (int **) malloc(sizeof(int *)*dmax);
        p->rev_global = (int **) malloc(sizeof(int *)*dmax);
        p->rev_partial = (int **) malloc(sizeof(int *)*dmax);
        p->c0 = (int **) malloc(sizeof(int *)*dmax);
        p->c1 = (int **) malloc(sizeof(int *)*dmax);
        int d;
        for (d = 0; d < dmax; ++d)
            {
            p->rev_j1[d] = (int *) malloc(sizeof(int)*ndim);
            p->rev_global[d] = (int *) malloc(sizeof(int)*ndim);
            p->rev_partial[d] = (int *) malloc(sizeof(int)*ndim);
            p->c0[d] = (int *) malloc(sizeof(int)*ndim);
            p->c1[d] = (int *) malloc(sizeof(int)*ndim);
            }

        p->dfft_multi = 1;
        }
    else
        {
        for (i = 0; i < ndim; ++i)
            {
            /* plan for short-distance butterflies */
            int st = size/p->inembed[i]*(gdim[i]/pdim[i]);

            #ifdef ENABLE_HOST
            int howmany = 1;
            #ifdef FFT1D_SUPPORTS_THREADS
            howmany = st/(p->k0[i]);
            #endif
            dfft_create_1d_plan(&(p->plans_short_forward[i]),p->k0[i],
                howmany, st/(p->k0[i]), 1, st/(p->k0[i]), 1, 0);
            dfft_create_1d_plan(&(p->plans_short_inverse[i]),p->k0[i],
                howmany, st/(p->k0[i]), 1, st/(p->k0[i]), 1, 1);

            /* plan for long-distance butterflies */
            int length = gdim[i]/pdim[i];
            #ifdef FFT1D_SUPPORTS_THREADS
            howmany = st/length;
            #endif
            dfft_create_1d_plan(&(p->plans_long_forward[i]), length,
                howmany, st/length,1, st/length,1, 0);
            dfft_create_1d_plan(&(p->plans_long_inverse[i]), length,
                howmany, st/length,1, st/length,1, 1);
            #else
            return 3;
            #endif

            size /= p->inembed[i];
            size *= p->oembed[i];
            }
        }

    /* Allocate scratch space */
    int scratch_size = 1;
    for (i = 0; i < ndim; ++i)
        scratch_size *= ((p->inembed[i] > p->oembed[i]) ? p->inembed[i]  : p->oembed[i]);
    p->scratch_size = scratch_size;

    if (!device)
        {
        #ifdef ENABLE_HOST
        dfft_allocate_aligned_memory(&(p->scratch),sizeof(cpx_t)*scratch_size);
        dfft_allocate_aligned_memory(&(p->scratch_2),sizeof(cpx_t)*scratch_size);
        dfft_allocate_aligned_memory(&(p->scratch_3),sizeof(cpx_t)*scratch_size);
        #else
        return 3;
        #endif
        }
    else
        {
        #ifdef ENABLE_CUDA
        dfft_cuda_allocate_aligned_memory(&(p->d_scratch),sizeof(cuda_cpx_t)*scratch_size);
        dfft_cuda_allocate_aligned_memory(&(p->d_scratch_2),sizeof(cuda_cpx_t)*scratch_size);
        dfft_cuda_allocate_aligned_memory(&(p->d_scratch_3),sizeof(cuda_cpx_t)*scratch_size);
        #else
        return 2;
        #endif
        }

    p->input_cyclic = input_cyclic;
    p->output_cyclic = output_cyclic;

    #ifdef ENABLE_CUDA
    #ifndef NDEBUG
    p->check_cuda_errors = 1;
    #else
    p->check_cuda_errors = 0;
    #endif
    #endif

    p->row_m = row_m;

    /* before plan creation is complete, an initialization run will
     * be performed */
    p->init = 1;

    return 0;
    }